

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O3

xmlXIncludeRefPtr xmlXIncludeExpandNode(xmlXIncludeCtxtPtr ctxt,xmlNodePtr node)

{
  uint uVar1;
  xmlElementType xVar2;
  _xmlNode *fallback;
  xmlDoc *doc;
  xmlNodeSetPtr pxVar3;
  xmlDocPtr pxVar4;
  byte bVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  xmlChar *pxVar10;
  xmlChar *pxVar11;
  xmlXIncludeRefPtr ref;
  xmlNodePtr pxVar12;
  xmlNodePtr copy;
  xmlParserCtxtPtr ctxt_00;
  xmlParserInputPtr value;
  xmlXPathContextPtr ctxt_01;
  xmlXPathObjectPtr obj;
  xmlXIncludeDoc *pxVar13;
  xmlChar *pxVar14;
  xmlNodePtr pxVar15;
  _xmlDtd *p_Var16;
  xmlXIncludeRefPtr *ppxVar17;
  char *pcVar18;
  long lVar19;
  _xmlDtd *p_Var20;
  uint uVar21;
  _xmlDict *dict;
  _xmlDoc *p_Var22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  xmlXIncludeRefPtr pxVar26;
  bool bVar27;
  xmlChar *base;
  xmlURIPtr uri;
  xmlDocPtr local_98;
  _xmlDoc *local_88;
  xmlChar *local_78;
  xmlChar *local_70;
  xmlDoc *local_68;
  xmlXIncludeCtxtPtr local_60;
  int *local_58;
  xmlXIncludeRefPtr *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (ctxt->fatalErr != 0) {
    return (xmlXIncludeRefPtr)0x0;
  }
  if (0x27 < ctxt->depth) {
    xmlXIncludeErr(ctxt,node,0x640,"maximum recursion depth exceeded\n",(xmlChar *)0x0);
    ctxt->fatalErr = 1;
    return (xmlXIncludeRefPtr)0x0;
  }
  if (0 < (long)ctxt->incNr) {
    lVar19 = 0;
    do {
      pxVar26 = ctxt->incTab[lVar19];
      if (pxVar26->elem == node) {
        if (pxVar26->expanding != 0) {
          xmlXIncludeErr(ctxt,node,0x640,"inclusion loop detected\n",(xmlChar *)0x0);
          return (xmlXIncludeRefPtr)0x0;
        }
        return pxVar26;
      }
      lVar19 = lVar19 + 1;
    } while (ctxt->incNr != lVar19);
  }
  local_68 = (xmlDoc *)0x0;
  local_78 = (xmlChar *)0x0;
  if (node == (xmlNodePtr)0x0) {
    return (xmlXIncludeRefPtr)0x0;
  }
  local_58 = &ctxt->incNr;
  local_88 = (_xmlDoc *)xmlXIncludeGetProp(ctxt,node,(xmlChar *)"xpointer");
  pxVar10 = xmlXIncludeGetProp(ctxt,node,"href");
  if (pxVar10 == (xmlChar *)0x0) {
    if (local_88 == (_xmlDoc *)0x0) {
      pxVar10 = (xmlChar *)0x0;
      xmlXIncludeErr(ctxt,node,0x643,"href or xpointer must be present\n",(xmlChar *)0x0);
      pxVar11 = (xmlChar *)0x0;
      local_88 = (_xmlDoc *)0x0;
    }
    else {
      pxVar10 = xmlStrdup("");
      if (pxVar10 != (xmlChar *)0x0) goto LAB_001b677c;
      ctxt->fatalErr = 1;
      ctxt->errNo = 2;
      ctxt->nbErrors = ctxt->nbErrors + 1;
      pxVar10 = (xmlChar *)0x0;
      xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                          (xmlError *)0x0);
      pxVar11 = (xmlChar *)0x0;
    }
LAB_001b6923:
    pxVar26 = (xmlXIncludeRefPtr)0x0;
    ref = (xmlXIncludeRefPtr)0x0;
  }
  else {
    iVar7 = xmlStrlen(pxVar10);
    if (2000 < iVar7) {
      pcVar18 = "URI too long\n";
      pxVar11 = (xmlChar *)0x0;
      iVar7 = 0x645;
      pxVar14 = (xmlChar *)0x0;
LAB_001b691b:
      xmlXIncludeErr(ctxt,node,iVar7,pcVar18,pxVar14);
      goto LAB_001b6923;
    }
LAB_001b677c:
    pxVar11 = xmlXIncludeGetProp(ctxt,node,(xmlChar *)"parse");
    iVar7 = 1;
    bVar5 = 1;
    if ((pxVar11 != (xmlChar *)0x0) &&
       (iVar8 = xmlStrEqual(pxVar11,(xmlChar *)"xml"), bVar5 = 1, iVar8 == 0)) {
      iVar8 = xmlStrEqual(pxVar11,"text");
      bVar5 = 0;
      iVar7 = 0;
      if (iVar8 == 0) {
        pcVar18 = "invalid value %s for \'parse\'\n";
        iVar7 = 0x641;
        pxVar14 = pxVar11;
        goto LAB_001b691b;
      }
    }
    iVar8 = xmlParseURISafe((char *)pxVar10,(xmlURIPtr *)&local_68);
    pxVar14 = pxVar10;
    if (local_68 == (xmlDoc *)0x0) {
      if (iVar8 < 0) {
        ctxt->fatalErr = 1;
        ctxt->errNo = 2;
        ctxt->nbErrors = ctxt->nbErrors + 1;
        xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                            (xmlError *)0x0);
        goto LAB_001b6923;
      }
      pcVar18 = "invalid value href %s\n";
      iVar7 = 0x645;
      goto LAB_001b691b;
    }
    p_Var22 = local_68->doc;
    if (p_Var22 != (_xmlDoc *)0x0) {
      if (ctxt->legacy == 0) {
        pcVar18 = "Invalid fragment identifier in URI %s use the xpointer attribute\n";
        iVar7 = 0x652;
        goto LAB_001b691b;
      }
      if (local_88 != (_xmlDoc *)0x0) {
        (*xmlFree)(p_Var22);
        p_Var22 = local_88;
      }
      local_68->doc = (_xmlDoc *)0x0;
      local_88 = p_Var22;
    }
    pxVar14 = xmlSaveUri((xmlURIPtr)local_68);
    local_70 = pxVar14;
    if (pxVar14 == (xmlChar *)0x0) {
      ctxt->fatalErr = 1;
      ctxt->errNo = 2;
      ctxt->nbErrors = ctxt->nbErrors + 1;
      pxVar26 = (xmlXIncludeRefPtr)0x0;
      xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                          (xmlError *)0x0);
LAB_001b6b3a:
      ref = (xmlXIncludeRefPtr)0x0;
    }
    else {
      (*xmlFree)(pxVar10);
      iVar8 = xmlNodeGetBaseSafe(ctxt->doc,node,&local_78);
      if (iVar8 < 0) {
        ctxt->fatalErr = 1;
        ctxt->errNo = 2;
        ctxt->nbErrors = ctxt->nbErrors + 1;
        xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                            (xmlError *)0x0);
LAB_001b6b37:
        pxVar26 = (xmlXIncludeRefPtr)0x0;
        pxVar10 = pxVar14;
        goto LAB_001b6b3a;
      }
      if (*pxVar14 != '\0') {
        iVar8 = xmlBuildURISafe(pxVar14,local_78,&local_70);
        if (iVar8 < 0) {
          xmlXIncludeErrMemory(ctxt);
        }
        else {
          if (local_70 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar14);
            pxVar14 = local_70;
            iVar8 = xmlStrEqual(local_70,ctxt->doc->URL);
            bVar27 = iVar8 != 0;
            goto LAB_001b6a30;
          }
          xmlXIncludeErr(ctxt,node,0x645,"failed build URL\n",(xmlChar *)0x0);
        }
        goto LAB_001b6b37;
      }
      bVar27 = true;
LAB_001b6a30:
      if (((bool)(bVar5 & bVar27)) &&
         ((local_88 == (_xmlDoc *)0x0 || (*(char *)&local_88->_private == '\0')))) {
        xmlXIncludeErr(ctxt,node,0x640,"detected a local recursion with no xpointer in %s\n",pxVar14
                      );
LAB_001b6b15:
        pxVar26 = (xmlXIncludeRefPtr)0x0;
        pxVar10 = pxVar14;
        goto LAB_001b6b3a;
      }
      ref = (xmlXIncludeRefPtr)(*xmlMalloc)(0x38);
      piVar6 = local_58;
      if (ref == (xmlXIncludeRefPtr)0x0) {
        xmlXIncludeErrMemory(ctxt);
        goto LAB_001b6b15;
      }
      ref->base = (xmlChar *)0x0;
      ref->elem = (xmlNodePtr)0x0;
      ref->inc = (xmlNodePtr)0x0;
      ref->xml = 0;
      ref->fallback = 0;
      ref->expanding = 0;
      ref->replace = 0;
      ref->elem = node;
      ref->xml = iVar7;
      ref->URI = pxVar14;
      ref->fragment = (xmlChar *)local_88;
      if ((((ctxt->parseFlags & 0x40000) != 0) || (node->doc == (_xmlDoc *)0x0)) ||
         ((node->doc->parseFlags & 0x40000) != 0)) {
LAB_001b72fc:
        iVar7 = ctxt->incNr;
        uVar1 = ctxt->incMax;
        if (iVar7 < (int)uVar1) {
          ppxVar17 = ctxt->incTab;
        }
        else {
          if ((int)uVar1 < 1) {
            uVar21 = 4;
          }
          else {
            if (999999999 < uVar1) goto LAB_001b7379;
            uVar23 = uVar1 + 1 >> 1;
            uVar21 = uVar23 + uVar1;
            if (1000000000 - uVar23 < uVar1) {
              uVar21 = 1000000000;
            }
          }
          ppxVar17 = (xmlXIncludeRefPtr *)(*xmlRealloc)(ctxt->incTab,(ulong)uVar21 << 3);
          if (ppxVar17 == (xmlXIncludeRefPtr *)0x0) goto LAB_001b7379;
          ctxt->incTab = ppxVar17;
          ctxt->incMax = uVar21;
          iVar7 = ctxt->incNr;
        }
        *piVar6 = iVar7 + 1;
        ppxVar17[iVar7] = ref;
        local_88 = (_xmlDoc *)0x0;
        pxVar10 = (xmlChar *)0x0;
        pxVar26 = ref;
        goto LAB_001b6b3a;
      }
      if (local_78 != (xmlChar *)0x0) {
        ref->base = local_78;
        local_78 = (xmlChar *)0x0;
        goto LAB_001b72fc;
      }
      pxVar10 = xmlStrdup("");
      ref->base = pxVar10;
      if (pxVar10 != (xmlChar *)0x0) goto LAB_001b72fc;
LAB_001b7379:
      xmlXIncludeErrMemory(ctxt);
      pxVar10 = (xmlChar *)0x0;
      local_88 = (_xmlDoc *)0x0;
      pxVar26 = (xmlXIncludeRefPtr)0x0;
    }
  }
  xmlXIncludeFreeRef(ref);
  xmlFreeURI((xmlURIPtr)local_68);
  (*xmlFree)(pxVar10);
  (*xmlFree)(pxVar11);
  (*xmlFree)(local_88);
  (*xmlFree)(local_78);
  if (pxVar26 == (xmlXIncludeRefPtr)0x0) {
    return (xmlXIncludeRefPtr)0x0;
  }
  pxVar26->expanding = 1;
  ctxt->depth = ctxt->depth + 1;
  pxVar15 = pxVar26->elem;
  if (pxVar15 == (xmlNodePtr)0x0) goto LAB_001b6f94;
  if (pxVar26->xml == 0) {
    iVar7 = xmlXIncludeLoadTxt(ctxt,pxVar26);
    if (-1 < iVar7) goto LAB_001b6f94;
  }
  else {
    pxVar10 = pxVar26->URI;
    pxVar11 = pxVar26->fragment;
    if (((*pxVar10 == '\0') || (*pxVar10 == '#')) ||
       ((ctxt->doc != (xmlDocPtr)0x0 && (iVar7 = xmlStrEqual(pxVar10,ctxt->doc->URL), iVar7 != 0))))
    {
      local_98 = ctxt->doc;
LAB_001b6be4:
      if (pxVar11 == (xmlChar *)0x0) {
        pxVar12 = xmlDocGetRootElement(local_98);
        if (pxVar12 == (xmlNodePtr)0x0) {
          pxVar12 = pxVar26->elem;
          pcVar18 = "document without root\n";
          iVar7 = 1;
          goto LAB_001b6ef8;
        }
        copy = xmlDocCopyNode(pxVar12,ctxt->doc,1);
        pxVar26->inc = copy;
        if (copy != (xmlNodePtr)0x0) {
          if (pxVar26->base != (xmlChar *)0x0) {
            xmlXIncludeBaseFixup(ctxt,pxVar12,copy,pxVar26->base);
          }
          goto LAB_001b6f94;
        }
LAB_001b6e17:
        ctxt->fatalErr = 1;
        ctxt->errNo = 2;
        ctxt->nbErrors = ctxt->nbErrors + 1;
        xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                            (xmlError *)0x0);
      }
      else {
        if ((ctxt->isStream == 0) || (local_98 != ctxt->doc)) {
          ctxt_01 = ctxt->xpctxt;
          if (ctxt_01 == (xmlXPathContextPtr)0x0) {
            ctxt_01 = xmlXPathNewContext(local_98);
            ctxt->xpctxt = ctxt_01;
            if (ctxt_01 == (xmlXPathContextPtr)0x0) goto LAB_001b6e17;
            if (ctxt->errorHandler != (xmlStructuredErrorFunc)0x0) {
              xmlXPathSetErrorHandler(ctxt_01,ctxt->errorHandler,ctxt->errorCtxt);
              ctxt_01 = ctxt->xpctxt;
            }
          }
          else {
            ctxt_01->doc = local_98;
          }
          obj = xmlXPtrEval(pxVar11,ctxt_01);
          iVar7 = (ctxt->xpctxt->lastError).code;
          if (iVar7 == 0) {
            if (obj == (xmlXPathObjectPtr)0x0) goto LAB_001b6f94;
            if ((XPATH_XSLT_TREE < obj->type) || ((0x31dU >> (obj->type & 0x1f) & 1) == 0)) {
              pxVar3 = obj->nodesetval;
              if ((pxVar3 != (xmlNodeSetPtr)0x0) && (0 < (long)pxVar3->nodeNr)) {
                lVar19 = 0;
                do {
                  if ((pxVar3->nodeTab[lVar19] != (xmlNodePtr)0x0) &&
                     (xVar2 = pxVar3->nodeTab[lVar19]->type,
                     xVar2 < (XML_XINCLUDE_END|XML_ELEMENT_NODE))) {
                    if ((0x1bdc00U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
                      if (xVar2 == XML_ATTRIBUTE_NODE) {
                        pxVar15 = pxVar26->elem;
                        pcVar18 = "XPointer selects an attribute: #%s\n";
                      }
                      else {
                        if (xVar2 != XML_NAMESPACE_DECL) goto LAB_001b7284;
                        pxVar15 = pxVar26->elem;
                        pcVar18 = "XPointer selects a namespace: #%s\n";
                      }
                    }
                    else {
                      pxVar15 = pxVar26->elem;
                      pcVar18 = "XPointer selects unexpected nodes: #%s\n";
                    }
                    xmlXIncludeErr(ctxt,pxVar15,0x64d,pcVar18,pxVar11);
                    goto LAB_001b73b0;
                  }
LAB_001b7284:
                  lVar19 = lVar19 + 1;
                } while (pxVar3->nodeNr != lVar19);
              }
              pxVar15 = xmlXIncludeCopyXPointer(ctxt,obj,pxVar26->base);
              pxVar26->inc = pxVar15;
LAB_001b73b0:
              xmlXPathFreeObject(obj);
              goto LAB_001b6f94;
            }
            xmlXIncludeErr(ctxt,pxVar26->elem,0x64d,"XPointer is not a range: #%s\n",pxVar11);
            xmlXPathFreeObject(obj);
            goto LAB_001b6f00;
          }
          if (iVar7 == 2) goto LAB_001b6e17;
          pxVar12 = pxVar26->elem;
          pcVar18 = "XPointer evaluation failed: #%s\n";
          iVar7 = 0x64c;
        }
        else {
          pxVar12 = pxVar26->elem;
          pcVar18 = "XPointer expressions not allowed in streaming mode\n";
          iVar7 = 0x64c;
LAB_001b6ef8:
          pxVar11 = (xmlChar *)0x0;
        }
        xmlXIncludeErr(ctxt,pxVar12,iVar7,pcVar18,pxVar11);
      }
    }
    else {
      if (0 < ctxt->urlNr) {
        lVar19 = 0;
        lVar24 = 0;
        do {
          iVar7 = xmlStrEqual(pxVar10,*(xmlChar **)((long)&ctxt->urlTab->url + lVar19));
          if (iVar7 != 0) {
            if (*(int *)((long)&ctxt->urlTab->expanding + lVar19) != 0) {
              pxVar12 = pxVar26->elem;
              pcVar18 = "inclusion loop detected\n";
              iVar7 = 0x640;
              goto LAB_001b6ef8;
            }
            local_98 = *(xmlDocPtr *)((long)&ctxt->urlTab->doc + lVar19);
            if (local_98 != (xmlDoc *)0x0) goto LAB_001b6be4;
            goto LAB_001b6f00;
          }
          lVar24 = lVar24 + 1;
          lVar19 = lVar19 + 0x18;
        } while (lVar24 < ctxt->urlNr);
      }
      uVar1 = ctxt->parseFlags;
      if (pxVar11 != (xmlChar *)0x0) {
        ctxt->parseFlags = uVar1 | 2;
      }
      xmlInitParser();
      ctxt_00 = xmlNewParserCtxt();
      if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
        ctxt->fatalErr = 1;
        ctxt->errNo = 2;
        ctxt->nbErrors = ctxt->nbErrors + 1;
        local_98 = (xmlDocPtr)0x0;
        xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                            (xmlError *)0x0);
      }
      else {
        if (ctxt->errorHandler != (xmlStructuredErrorFunc)0x0) {
          xmlCtxtSetErrorHandler(ctxt_00,ctxt->errorHandler,ctxt->errorCtxt);
        }
        if (ctxt->resourceLoader != (xmlResourceLoader)0x0) {
          xmlCtxtSetResourceLoader(ctxt_00,ctxt->resourceLoader,ctxt->resourceCtxt);
        }
        ctxt_00->_private = ctxt->_private;
        if ((ctxt->doc != (xmlDocPtr)0x0) && (dict = ctxt->doc->dict, dict != (_xmlDict *)0x0)) {
          if (ctxt_00->dict != (xmlDictPtr)0x0) {
            xmlDictFree(ctxt_00->dict);
            dict = ctxt->doc->dict;
          }
          ctxt_00->dict = dict;
          xmlDictReference(dict);
        }
        xmlCtxtUseOptions(ctxt_00,ctxt->parseFlags | 4);
        local_98 = (xmlDocPtr)0x0;
        value = xmlLoadResource(ctxt_00,(char *)pxVar10,(char *)0x0,XML_RESOURCE_XINCLUDE);
        if (value != (xmlParserInputPtr)0x0) {
          iVar7 = xmlCtxtPushInput(ctxt_00,value);
          if (iVar7 < 0) {
            xmlFreeInputStream(value);
          }
          else {
            xmlParseDocument(ctxt_00);
            local_98 = ctxt_00->myDoc;
            if (ctxt_00->wellFormed != 0) goto LAB_001b7033;
            if (local_98 != (xmlDocPtr)0x0) {
              xmlFreeDoc(local_98);
            }
            ctxt_00->myDoc = (xmlDocPtr)0x0;
          }
          local_98 = (xmlDocPtr)0x0;
        }
LAB_001b7033:
        iVar7 = xmlCtxtIsCatastrophicError(ctxt_00);
        if (iVar7 != 0) {
          xmlXIncludeErr(ctxt,(xmlNodePtr)0x0,ctxt_00->errNo,"parser error",(xmlChar *)0x0);
        }
        xmlFreeParserCtxt(ctxt_00);
      }
      ctxt->parseFlags = uVar1;
      iVar7 = ctxt->urlNr;
      uVar1 = ctxt->urlMax;
      if (iVar7 < (int)uVar1) {
        pxVar13 = ctxt->urlTab;
LAB_001b70df:
        pxVar13[iVar7].doc = local_98;
        pxVar14 = xmlStrdup(pxVar10);
        pxVar13[iVar7].url = pxVar14;
        if (pxVar14 != (xmlChar *)0x0) {
          pxVar13[iVar7].expanding = 0;
          iVar8 = ctxt->urlNr;
          ctxt->urlNr = iVar8 + 1;
          if (local_98 == (xmlDocPtr)0x0) goto LAB_001b6f00;
          if (local_98->URL != (xmlChar *)0x0) {
            xmlStrEqual(pxVar10,local_98->URL);
          }
          p_Var20 = local_98->intSubset;
          if (p_Var20 != (_xmlDtd *)0x0) {
            doc = ctxt->doc;
            p_Var16 = doc->intSubset;
            if (p_Var16 == (_xmlDtd *)0x0) {
              pxVar12 = xmlDocGetRootElement(doc);
              if (pxVar12 != (xmlNodePtr)0x0) {
                p_Var16 = xmlCreateIntSubset(doc,pxVar12->name,(xmlChar *)0x0,(xmlChar *)0x0);
                if (p_Var16 != (xmlDtdPtr)0x0) {
                  p_Var20 = local_98->intSubset;
                  if (p_Var20 != (_xmlDtd *)0x0) goto LAB_001b7166;
                  goto LAB_001b7191;
                }
                ctxt->fatalErr = 1;
                ctxt->errNo = 2;
                ctxt->nbErrors = ctxt->nbErrors + 1;
                xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                                    (xmlError *)0x0);
              }
            }
            else {
LAB_001b7166:
              if ((xmlHashTablePtr)p_Var20->entities != (xmlHashTablePtr)0x0) {
                local_68 = doc;
                local_60 = ctxt;
                xmlHashScan((xmlHashTablePtr)p_Var20->entities,xmlXIncludeMergeEntity,&local_68);
              }
LAB_001b7191:
              p_Var20 = local_98->extSubset;
              if ((((p_Var20 != (_xmlDtd *)0x0) && (p_Var20->entities != (void *)0x0)) &&
                  (local_68 = doc, local_60 = ctxt,
                  iVar9 = xmlStrEqual(p_Var16->ExternalID,p_Var20->ExternalID), iVar9 == 0)) &&
                 (iVar9 = xmlStrEqual(p_Var16->SystemID,p_Var20->SystemID), iVar9 == 0)) {
                xmlHashScan((xmlHashTablePtr)p_Var20->entities,xmlXIncludeMergeEntity,&local_68);
              }
            }
          }
          piVar6 = local_58;
          pxVar13[iVar7].expanding = 1;
          pxVar4 = ctxt->doc;
          local_50 = ctxt->incTab;
          local_48._0_4_ = ctxt->incNr;
          local_48._4_4_ = ctxt->incMax;
          uStack_40 = 0;
          iVar7 = ctxt->isStream;
          ctxt->doc = local_98;
          ctxt->isStream = 0;
          local_58[0] = 0;
          local_58[1] = 0;
          *(xmlXIncludeRefPtr **)(local_58 + 2) = (xmlXIncludeRefPtr *)0x0;
          pxVar12 = xmlDocGetRootElement(local_98);
          xmlXIncludeDoProcess(ctxt,pxVar12);
          ppxVar17 = ctxt->incTab;
          if (ppxVar17 != (xmlXIncludeRefPtr *)0x0) {
            if (0 < *piVar6) {
              lVar19 = 0;
              do {
                xmlXIncludeFreeRef(ctxt->incTab[lVar19]);
                lVar19 = lVar19 + 1;
              } while (lVar19 < ctxt->incNr);
              ppxVar17 = ctxt->incTab;
            }
            (*xmlFree)(ppxVar17);
          }
          ctxt->doc = pxVar4;
          ctxt->incNr = (undefined4)local_48;
          ctxt->incMax = local_48._4_4_;
          ctxt->incTab = local_50;
          ctxt->isStream = iVar7;
          ctxt->urlTab[iVar8].expanding = 0;
          goto LAB_001b6be4;
        }
        ctxt->fatalErr = 1;
        ctxt->errNo = 2;
        ctxt->nbErrors = ctxt->nbErrors + 1;
        xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                            (xmlError *)0x0);
      }
      else {
        if ((int)uVar1 < 1) {
          uVar25 = 8;
LAB_001b70b0:
          pxVar13 = (xmlXIncludeDoc *)(*xmlRealloc)(ctxt->urlTab,uVar25 * 0x18);
          if (pxVar13 != (xmlXIncludeDoc *)0x0) {
            ctxt->urlMax = (int)uVar25;
            ctxt->urlTab = pxVar13;
            iVar7 = ctxt->urlNr;
            goto LAB_001b70df;
          }
        }
        else if (uVar1 < 1000000000) {
          uVar23 = uVar1 + 1 >> 1;
          uVar21 = uVar23 + uVar1;
          if (1000000000 - uVar23 < uVar1) {
            uVar21 = 1000000000;
          }
          uVar25 = (ulong)uVar21;
          goto LAB_001b70b0;
        }
        xmlXIncludeErrMemory(ctxt);
      }
      xmlFreeDoc(local_98);
    }
  }
LAB_001b6f00:
  for (fallback = pxVar15->children; fallback != (xmlNodePtr)0x0; fallback = fallback->next) {
    if ((((fallback->type == XML_ELEMENT_NODE) && (fallback->ns != (xmlNs *)0x0)) &&
        (iVar7 = xmlStrEqual(fallback->name,(xmlChar *)"fallback"), iVar7 != 0)) &&
       ((iVar7 = xmlStrEqual(fallback->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
        iVar7 != 0 ||
        (iVar7 = xmlStrEqual(fallback->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
        iVar7 != 0)))) {
      iVar7 = xmlXIncludeLoadFallback(ctxt,fallback,pxVar26);
      if (-1 < iVar7) goto LAB_001b6f94;
      break;
    }
  }
  xmlXIncludeErr(ctxt,pxVar15,0x644,"could not load %s, and no fallback was found\n",pxVar26->URI);
LAB_001b6f94:
  ctxt->depth = ctxt->depth + -1;
  pxVar26->expanding = 0;
  return pxVar26;
}

Assistant:

static xmlXIncludeRefPtr
xmlXIncludeExpandNode(xmlXIncludeCtxtPtr ctxt, xmlNodePtr node) {
    xmlXIncludeRefPtr ref;
    int i;

    if (ctxt->fatalErr)
        return(NULL);
    if (ctxt->depth >= XINCLUDE_MAX_DEPTH) {
        xmlXIncludeErr(ctxt, node, XML_XINCLUDE_RECURSION,
                       "maximum recursion depth exceeded\n", NULL);
        ctxt->fatalErr = 1;
        return(NULL);
    }

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    /*
     * The XInclude engine offers no protection against exponential
     * expansion attacks similar to "billion laughs". Avoid timeouts by
     * limiting the total number of replacements when fuzzing.
     *
     * Unfortuately, a single XInclude can already result in quadratic
     * behavior:
     *
     *     <doc xmlns:xi="http://www.w3.org/2001/XInclude">
     *       <xi:include xpointer="xpointer(//e)"/>
     *       <e>
     *         <e>
     *           <e>
     *             <!-- more nested elements -->
     *           </e>
     *         </e>
     *       </e>
     *     </doc>
     */
    if (ctxt->incTotal >= 20)
        return(NULL);
    ctxt->incTotal++;
#endif

    for (i = 0; i < ctxt->incNr; i++) {
        if (ctxt->incTab[i]->elem == node) {
            if (ctxt->incTab[i]->expanding) {
                xmlXIncludeErr(ctxt, node, XML_XINCLUDE_RECURSION,
                               "inclusion loop detected\n", NULL);
                return(NULL);
            }
            return(ctxt->incTab[i]);
        }
    }

    ref = xmlXIncludeAddNode(ctxt, node);
    if (ref == NULL)
        return(NULL);
    ref->expanding = 1;
    ctxt->depth++;
    xmlXIncludeLoadNode(ctxt, ref);
    ctxt->depth--;
    ref->expanding = 0;

    return(ref);
}